

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_mol.cpp
# Opt level: O0

void MOL::ComputeSyncAofs
               (MultiFab *aofs,int aofs_comp,int ncomp,MultiFab *state,int state_comp,MultiFab *umac
               ,MultiFab *vmac,MultiFab *wmac,MultiFab *ucorr,MultiFab *vcorr,MultiFab *wcorr,
               MultiFab *xedge,MultiFab *yedge,MultiFab *zedge,int edge_comp,bool known_edgestate,
               MultiFab *xfluxes,MultiFab *yfluxes,MultiFab *zfluxes,int fluxes_comp,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,BCRec *d_bcrec_ptr,
               Geometry *geom,bool is_velocity)

{
  __uniq_ptr_data<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>,_true,_true>
  _Var1;
  Long LVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FabArray<amrex::FArrayBox> *pFVar6;
  MFItInfo *this;
  FabArrayBase *in_RCX;
  int in_EDX;
  int in_ESI;
  FabArrayBase *in_RDI;
  int in_R8D;
  FabArrayBase *in_stack_00000030;
  FabArrayBase *in_stack_00000038;
  FabArrayBase *in_stack_00000040;
  int in_stack_00000048;
  byte in_stack_00000050;
  FabArrayBase *in_stack_00000058;
  FabArrayBase *in_stack_00000060;
  FabArrayBase *in_stack_00000068;
  int in_stack_00000070;
  Geometry *in_stack_00000088;
  byte in_stack_00000090;
  Array4<double> *aofs_arr;
  Real mult;
  Array4<double> divtmp_arr;
  Elixir eli;
  FArrayBox tmpfab;
  int tmpcomp;
  Box tmpbox;
  Array4<const_double> w;
  Array4<const_double> v;
  Array4<const_double> u;
  Array4<const_double> q;
  Array4<const_double> wc;
  Array4<const_double> vc;
  Array4<const_double> uc;
  Array4<double> zed;
  Array4<double> yed;
  Array4<double> xed;
  Array4<double> fz;
  Array4<double> fy;
  Array4<double> fx;
  Box *bx;
  MFIter mfi;
  MFItInfo mfi_info;
  Box *domain;
  bool fluxes_are_area_weighted;
  int i;
  Geometry *in_stack_fffffffffffff508;
  MFIter *in_stack_fffffffffffff510;
  MFIter *pMVar7;
  Array4<const_double> *pAVar8;
  undefined4 uVar9;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff518;
  FabArray<amrex::FArrayBox> *b;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff520;
  MFItInfo *in_stack_fffffffffffff530;
  uint in_stack_fffffffffffff538;
  undefined4 in_stack_fffffffffffff53c;
  MFIter *in_stack_fffffffffffff540;
  anon_class_128_2_5a455570 *f;
  MFIter *in_stack_fffffffffffff570;
  undefined1 local_a18 [64];
  undefined1 auStack_9d8 [64];
  undefined1 local_998 [7];
  undefined1 in_stack_fffffffffffff66f;
  Real in_stack_fffffffffffff670;
  int in_stack_fffffffffffff67c;
  Array4<const_double> *in_stack_fffffffffffff680;
  Array4<const_double> *in_stack_fffffffffffff688;
  Array4<const_double> *in_stack_fffffffffffff690;
  Array4<double> *in_stack_fffffffffffff698;
  Box *in_stack_fffffffffffff6a0;
  Array4<const_double> local_950;
  Geometry *in_stack_fffffffffffff710;
  char *in_stack_fffffffffffff728;
  int in_stack_fffffffffffff734;
  char *in_stack_fffffffffffff738;
  char *in_stack_fffffffffffff740;
  Array4<const_double> local_808;
  Array4<double> local_7c8;
  undefined1 in_stack_fffffffffffff87f;
  Array4<const_double> *in_stack_fffffffffffff880;
  RefID in_stack_fffffffffffff888;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> in_stack_fffffffffffff890;
  FabArrayBase *in_stack_fffffffffffff898;
  MultiArray4<double> in_stack_fffffffffffff8a0;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> in_stack_fffffffffffff8a8;
  __uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  local_718;
  __uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  local_710;
  undefined4 local_708;
  undefined1 local_6f8 [128];
  Geometry local_678;
  Array4<const_double> *in_stack_fffffffffffffab0;
  Array4<const_double> *in_stack_fffffffffffffab8;
  Array4<const_double> *in_stack_fffffffffffffac0;
  Array4<const_double> *in_stack_fffffffffffffac8;
  Geometry *in_stack_fffffffffffffad0;
  int in_stack_fffffffffffffad8;
  undefined1 in_stack_fffffffffffffb43;
  int in_stack_fffffffffffffb44;
  Array4<const_double> *in_stack_fffffffffffffb48;
  Array4<double> *in_stack_fffffffffffffb50;
  Array4<double> *in_stack_fffffffffffffb58;
  Array4<double> *in_stack_fffffffffffffb60;
  Box *in_stack_fffffffffffffb68;
  Array4<double> local_478;
  Array4<double> local_438;
  Array4<double> local_3f8;
  anon_class_128_2_5a455570 *local_398;
  Array4<const_double> *in_stack_fffffffffffffcb0;
  Array4<const_double> *in_stack_fffffffffffffcb8;
  Array4<const_double> *in_stack_fffffffffffffcc0;
  Box *in_stack_fffffffffffffcc8;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_fffffffffffffcd0;
  BCRec *in_stack_fffffffffffffcd8;
  int local_14c;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  int local_c4;
  int *local_c0;
  double *local_b8;
  Dim3 local_b0;
  int *local_a0;
  int local_98;
  undefined4 uStack_94;
  int local_90;
  undefined4 local_8c;
  int *local_88;
  undefined4 local_7c;
  int *local_78;
  undefined4 local_6c;
  int *local_68;
  Dim3 local_60;
  int *local_50;
  int local_48;
  int iStack_44;
  int local_40;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  
  iVar4 = amrex::FabArrayBase::nComp(in_RCX);
  if (iVar4 < in_R8D + in_EDX) {
    amrex::Assert_host(in_stack_fffffffffffff740,in_stack_fffffffffffff738,in_stack_fffffffffffff734
                       ,in_stack_fffffffffffff728);
  }
  iVar4 = amrex::FabArrayBase::nComp(in_RDI);
  if (iVar4 < in_ESI + in_EDX) {
    amrex::Assert_host(in_stack_fffffffffffff740,in_stack_fffffffffffff738,in_stack_fffffffffffff734
                       ,in_stack_fffffffffffff728);
  }
  iVar4 = amrex::FabArrayBase::nComp(in_stack_00000030);
  if (iVar4 < in_stack_00000048 + in_EDX) {
    amrex::Assert_host(in_stack_fffffffffffff740,in_stack_fffffffffffff738,in_stack_fffffffffffff734
                       ,in_stack_fffffffffffff728);
  }
  iVar4 = amrex::FabArrayBase::nComp(in_stack_00000038);
  if (iVar4 < in_stack_00000048 + in_EDX) {
    amrex::Assert_host(in_stack_fffffffffffff740,in_stack_fffffffffffff738,in_stack_fffffffffffff734
                       ,in_stack_fffffffffffff728);
  }
  iVar4 = amrex::FabArrayBase::nComp(in_stack_00000040);
  if (iVar4 < in_stack_00000048 + in_EDX) {
    amrex::Assert_host(in_stack_fffffffffffff740,in_stack_fffffffffffff738,in_stack_fffffffffffff734
                       ,in_stack_fffffffffffff728);
  }
  iVar4 = amrex::FabArrayBase::nComp(in_stack_00000058);
  if (iVar4 < in_stack_00000070 + in_EDX) {
    amrex::Assert_host(in_stack_fffffffffffff740,in_stack_fffffffffffff738,in_stack_fffffffffffff734
                       ,in_stack_fffffffffffff728);
  }
  iVar4 = amrex::FabArrayBase::nComp(in_stack_00000060);
  if (iVar4 < in_stack_00000070 + in_EDX) {
    amrex::Assert_host(in_stack_fffffffffffff740,in_stack_fffffffffffff738,in_stack_fffffffffffff734
                       ,in_stack_fffffffffffff728);
  }
  iVar4 = amrex::FabArrayBase::nComp(in_stack_00000068);
  if (iVar4 < in_stack_00000070 + in_EDX) {
    amrex::Assert_host(in_stack_fffffffffffff740,in_stack_fffffffffffff738,in_stack_fffffffffffff734
                       ,in_stack_fffffffffffff728);
  }
  iVar4 = amrex::FabArrayBase::nGrow(in_stack_00000058,0);
  iVar5 = amrex::FabArrayBase::nGrow(in_stack_00000030,0);
  if (iVar4 != iVar5) {
    amrex::Assert_host(in_stack_fffffffffffff740,in_stack_fffffffffffff738,in_stack_fffffffffffff734
                       ,in_stack_fffffffffffff728);
  }
  iVar4 = amrex::FabArrayBase::nGrow(in_stack_00000060,0);
  iVar5 = amrex::FabArrayBase::nGrow(in_stack_00000038,0);
  if (iVar4 != iVar5) {
    amrex::Assert_host(in_stack_fffffffffffff740,in_stack_fffffffffffff738,in_stack_fffffffffffff734
                       ,in_stack_fffffffffffff728);
  }
  iVar4 = amrex::FabArrayBase::nGrow(in_stack_00000068,0);
  iVar5 = amrex::FabArrayBase::nGrow(in_stack_00000040,0);
  if (iVar4 != iVar5) {
    amrex::Assert_host(in_stack_fffffffffffff740,in_stack_fffffffffffff738,in_stack_fffffffffffff734
                       ,in_stack_fffffffffffff728);
  }
  if ((in_stack_00000050 & 1) == 0) {
    iVar4 = amrex::FabArrayBase::nGrow(in_RCX,0);
    iVar5 = amrex::FabArrayBase::nGrow(in_stack_00000030,0);
    if (iVar4 < iVar5 + 2) {
      amrex::Assert_host(in_stack_fffffffffffff740,in_stack_fffffffffffff738,
                         in_stack_fffffffffffff734,in_stack_fffffffffffff728);
    }
  }
  pFVar6 = (FabArray<amrex::FArrayBox> *)amrex::Geometry::Domain(in_stack_00000088);
  amrex::MFItInfo::MFItInfo((MFItInfo *)in_stack_fffffffffffff520);
  this = amrex::MFItInfo::EnableTiling
                   ((MFItInfo *)&stack0xfffffffffffffcd4,
                    (IntVect *)&amrex::FabArrayBase::mfiter_tile_size);
  amrex::MFItInfo::SetDynamic(this,true);
  amrex::MFIter::MFIter
            (in_stack_fffffffffffff540,
             (FabArrayBase *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
             in_stack_fffffffffffff530);
  while (bVar3 = amrex::MFIter::isValid((MFIter *)&stack0xfffffffffffffc70), bVar3) {
    amrex::MFIter::tilebox(in_stack_fffffffffffff570);
    local_398 = (anon_class_128_2_5a455570 *)&stack0xfffffffffffffc4c;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff520,(MFIter *)in_stack_fffffffffffff518,
               (int)((ulong)in_stack_fffffffffffff510 >> 0x20));
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff520,(MFIter *)in_stack_fffffffffffff518,
               (int)((ulong)in_stack_fffffffffffff510 >> 0x20));
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff520,(MFIter *)in_stack_fffffffffffff518,
               (int)((ulong)in_stack_fffffffffffff510 >> 0x20));
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff520,(MFIter *)in_stack_fffffffffffff518,
               (int)((ulong)in_stack_fffffffffffff510 >> 0x20));
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff520,(MFIter *)in_stack_fffffffffffff518,
               (int)((ulong)in_stack_fffffffffffff510 >> 0x20));
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff520,(MFIter *)in_stack_fffffffffffff518,
               (int)((ulong)in_stack_fffffffffffff510 >> 0x20));
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff518,in_stack_fffffffffffff510);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff518,in_stack_fffffffffffff510);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff518,in_stack_fffffffffffff510);
    pMVar7 = in_stack_fffffffffffff510;
    b = in_stack_fffffffffffff518;
    if ((in_stack_00000050 & 1) == 0) {
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff520,(MFIter *)in_stack_fffffffffffff518,
                 (int)((ulong)in_stack_fffffffffffff510 >> 0x20));
      in_stack_fffffffffffff508 = &local_678;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff518,in_stack_fffffffffffff510);
      pMVar7 = (MFIter *)(local_6f8 + 0x40);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff518,in_stack_fffffffffffff510);
      b = (FabArray<amrex::FArrayBox> *)local_6f8;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff518,in_stack_fffffffffffff510);
      in_stack_fffffffffffff538 = (uint)(in_stack_00000090 & 1);
      in_stack_fffffffffffff520 = pFVar6;
      ComputeEdgeState(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffb58
                       ,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                       in_stack_fffffffffffffb44,in_stack_fffffffffffffcb0,in_stack_fffffffffffffcb8
                       ,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcc8,
                       in_stack_fffffffffffffcd0,in_stack_fffffffffffffcd8,
                       (bool)in_stack_fffffffffffffb43);
    }
    local_718._M_t.
    super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl =
         (tuple<amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
          )(local_398->aofs_arr).jstride;
    _Var1.
    super___uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl =
         (__uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
          )(local_398->aofs_arr).kstride;
    LVar2 = (local_398->aofs_arr).nstride;
    for (local_14c = 0; local_14c < 3; local_14c = local_14c + 1) {
      if (((uint)LVar2 & 1 << ((byte)local_14c & 0x1f)) == 0) {
        *(int *)((long)&local_718._M_t.
                        super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
                        .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>.
                        _M_head_impl + (long)local_14c * 4 + 4) =
             *(int *)((long)&local_718._M_t.
                             super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
                             .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>.
                             _M_head_impl + (long)local_14c * 4 + 4) + 1;
      }
    }
    local_708 = 7;
    local_710._M_t.
    super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl =
         (tuple<amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
          )(tuple<amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
            )_Var1.
             super___uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl;
    amrex::FArrayBox::FArrayBox
              ((FArrayBox *)in_stack_fffffffffffff520,(Box *)b,(int)((ulong)pMVar7 >> 0x20),
               SUB81((ulong)pMVar7 >> 0x18,0),SUB81((ulong)pMVar7 >> 0x10,0),
               (Arena *)in_stack_fffffffffffff508);
    in_stack_fffffffffffff570 = (MFIter *)&stack0xfffffffffffff890;
    amrex::BaseFab<double>::elixir<double,_0>
              ((BaseFab<double> *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
    local_b8 = *(double **)(in_stack_fffffffffffff570->tile_size).vect;
    local_c0 = (in_stack_fffffffffffff570->tile_size).vect + 2;
    local_c4._0_1_ = in_stack_fffffffffffff570->dynamic;
    local_c4._1_1_ = in_stack_fffffffffffff570->device_sync;
    local_c4._2_2_ = *(undefined2 *)&in_stack_fffffffffffff570->field_0x36;
    local_6c = 0;
    local_98 = *local_c0;
    local_7c = 1;
    uStack_94 = *(undefined4 *)&in_stack_fffffffffffff570->flags;
    local_e0._0_8_ = *(undefined8 *)local_c0;
    local_8c = 2;
    local_e0.z = in_stack_fffffffffffff570->currentIndex;
    local_18 = &in_stack_fffffffffffff570->beginIndex;
    local_1c = 0;
    local_48 = *local_18 + 1;
    local_28 = &in_stack_fffffffffffff570->beginIndex;
    local_2c = 1;
    iStack_44 = in_stack_fffffffffffff570->endIndex + 1;
    local_38 = &in_stack_fffffffffffff570->beginIndex;
    local_3c = 2;
    local_f0.z = in_stack_fffffffffffff570->streams + 1;
    local_f0.y = iStack_44;
    local_f0.x = local_48;
    local_d0._0_8_ = local_e0._0_8_;
    local_d0.z = local_e0.z;
    local_b0._0_8_ = local_e0._0_8_;
    local_b0.z = local_e0.z;
    local_a0 = local_c0;
    local_90 = local_e0.z;
    local_88 = local_c0;
    local_78 = local_c0;
    local_68 = local_c0;
    local_60._0_8_ = local_f0._0_8_;
    local_60.z = local_f0.z;
    local_50 = local_c0;
    local_40 = local_f0.z;
    amrex::Array4<double>::Array4(&local_7c8,local_b8,&local_d0,&local_f0,local_c4);
    pAVar8 = &local_808;
    amrex::Array4<const_double>::Array4<const_double,_0>
              (pAVar8,(Array4<double> *)&stack0xfffffffffffffb48);
    in_stack_fffffffffffff518 = (FabArray<amrex::FArrayBox> *)&stack0xfffffffffffff7b8;
    amrex::Array4<const_double>::Array4<const_double,_0>
              ((Array4<const_double> *)in_stack_fffffffffffff518,
               (Array4<double> *)&stack0xfffffffffffffb08);
    in_stack_fffffffffffff520 = (FabArray<amrex::FArrayBox> *)&stack0xfffffffffffff778;
    amrex::Array4<const_double>::Array4<const_double,_0>
              ((Array4<const_double> *)in_stack_fffffffffffff520,
               (Array4<double> *)&stack0xfffffffffffffac8);
    in_stack_fffffffffffff538 = 1;
    HydroUtils::ComputeFluxes
              ((Box *)in_stack_fffffffffffff8a8._M_head_impl,in_stack_fffffffffffff8a0.hp,
               (Array4<double> *)in_stack_fffffffffffff898,
               (Array4<double> *)in_stack_fffffffffffff890._M_head_impl,
               (Array4<const_double> *)in_stack_fffffffffffff888.data,in_stack_fffffffffffff880,
               in_stack_fffffffffffffab0,in_stack_fffffffffffffab8,in_stack_fffffffffffffac0,
               in_stack_fffffffffffffac8,in_stack_fffffffffffffad0,in_stack_fffffffffffffad8,
               (bool)in_stack_fffffffffffff87f);
    uVar9 = (undefined4)((ulong)pAVar8 >> 0x20);
    pAVar8 = (Array4<const_double> *)&stack0xfffffffffffff730;
    f = local_398;
    amrex::Array4<const_double>::Array4<const_double,_0>(pAVar8,&local_3f8);
    iVar4 = (int)((ulong)pAVar8 >> 0x20);
    pAVar8 = (Array4<const_double> *)&stack0xfffffffffffff6f0;
    amrex::Array4<const_double>::Array4<const_double,_0>(pAVar8,&local_438);
    amrex::Array4<const_double>::Array4<const_double,_0>(&local_950,&local_478);
    in_stack_fffffffffffff510 = (MFIter *)CONCAT44(uVar9,1);
    in_stack_fffffffffffff508 = in_stack_00000088;
    HydroUtils::ComputeDivergence
              (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,in_stack_fffffffffffff690,
               in_stack_fffffffffffff688,in_stack_fffffffffffff680,in_stack_fffffffffffff67c,
               in_stack_fffffffffffff710,in_stack_fffffffffffff670,(bool)in_stack_fffffffffffff66f);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff520,(MFIter *)in_stack_fffffffffffff518,
               (int)((ulong)in_stack_fffffffffffff510 >> 0x20));
    memcpy(local_a18,local_998,0x3c);
    memcpy(auStack_9d8,&local_7c8,0x3c);
    amrex::
    ParallelFor<int,MOL::ComputeSyncAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Geometry_const&,bool)::__0,void>
              ((Box *)pAVar8,iVar4,f);
    amrex::Gpu::streamSynchronize();
    amrex::Gpu::Elixir::~Elixir((Elixir *)in_stack_fffffffffffff510);
    amrex::FArrayBox::~FArrayBox((FArrayBox *)0x67edcc);
    amrex::MFIter::operator++((MFIter *)&stack0xfffffffffffffc70);
  }
  amrex::MFIter::~MFIter(in_stack_fffffffffffff510);
  return;
}

Assistant:

void
MOL::ComputeSyncAofs ( MultiFab& aofs, int aofs_comp, int ncomp,
                       MultiFab const& state, int state_comp,
                       AMREX_D_DECL( MultiFab const& umac,
                                     MultiFab const& vmac,
                                     MultiFab const& wmac),
                       AMREX_D_DECL( MultiFab const& ucorr,
                                     MultiFab const& vcorr,
                                     MultiFab const& wcorr),
                       AMREX_D_DECL( MultiFab& xedge,
                                     MultiFab& yedge,
                                     MultiFab& zedge),
                       int  edge_comp,
                       bool known_edgestate,
                       AMREX_D_DECL( MultiFab& xfluxes,
                                     MultiFab& yfluxes,
                                     MultiFab& zfluxes),
                       int fluxes_comp,
                       Vector<BCRec> const& bcs,
                       BCRec  const* d_bcrec_ptr,
                       Geometry const&  geom,
                       const bool is_velocity)

{
    BL_PROFILE("MOL::ComputeSyncAofs()");

    bool fluxes_are_area_weighted = true;

    AMREX_ALWAYS_ASSERT(state.nComp() >= state_comp + ncomp);
    AMREX_ALWAYS_ASSERT(aofs.nComp()  >= aofs_comp  + ncomp);
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xedge.nComp() >= edge_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(yedge.nComp() >= edge_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(zedge.nComp() >= edge_comp  + ncomp););
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xfluxes.nComp() >= fluxes_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(yfluxes.nComp() >= fluxes_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(zfluxes.nComp() >= fluxes_comp  + ncomp););
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xfluxes.nGrow() == xedge.nGrow());,
                  AMREX_ALWAYS_ASSERT(yfluxes.nGrow() == yedge.nGrow());,
                  AMREX_ALWAYS_ASSERT(zfluxes.nGrow() == zedge.nGrow()););

    // To compute edge states, need at least 2 more ghost cells in state than in
    //  xedge
    if ( !known_edgestate ) {
        AMREX_ALWAYS_ASSERT(state.nGrow() >= xedge.nGrow()+2);
    }

    Box  const& domain = geom.Domain();

    MFItInfo mfi_info;

    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,mfi_info); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();

        AMREX_D_TERM( Array4<Real> fx = xfluxes.array(mfi,fluxes_comp);,
                      Array4<Real> fy = yfluxes.array(mfi,fluxes_comp);,
                      Array4<Real> fz = zfluxes.array(mfi,fluxes_comp););

        AMREX_D_TERM( Array4<Real> xed = xedge.array(mfi,edge_comp);,
                      Array4<Real> yed = yedge.array(mfi,edge_comp);,
                      Array4<Real> zed = zedge.array(mfi,edge_comp););

        AMREX_D_TERM( Array4<Real const> uc = ucorr.const_array(mfi);,
                      Array4<Real const> vc = vcorr.const_array(mfi);,
                      Array4<Real const> wc = wcorr.const_array(mfi););

        // Compute edge state if needed
        if (!known_edgestate)
        {
            Array4<Real const> const q = state.const_array(mfi,state_comp);

            AMREX_D_TERM( Array4<Real const> u = umac.const_array(mfi);,
                          Array4<Real const> v = vmac.const_array(mfi);,
                          Array4<Real const> w = wmac.const_array(mfi););

            ComputeEdgeState( bx, AMREX_D_DECL( xed, yed, zed ), q, ncomp,
                              AMREX_D_DECL( u, v, w ), domain, bcs, d_bcrec_ptr,
                              is_velocity);

        }

        // Temporary divergence
        Box tmpbox = amrex::surroundingNodes(bx);
        int tmpcomp = ncomp*AMREX_SPACEDIM;
        FArrayBox tmpfab(tmpbox, tmpcomp);
        Elixir eli = tmpfab.elixir();
        Array4<Real> divtmp_arr = tmpfab.array();

        // Compute fluxes
        HydroUtils::ComputeFluxes( bx,
                                   AMREX_D_DECL(fx,fy,fz),
                                   AMREX_D_DECL(uc,vc,wc),
                                   AMREX_D_DECL(xed,yed,zed),
                                   geom, ncomp, fluxes_are_area_weighted );

        // Compute divergence
        Real mult = -1.0;
        HydroUtils::ComputeDivergence( bx, divtmp_arr,
                                       AMREX_D_DECL(fx,fy,fz),
                                       ncomp, geom,
                                       mult, fluxes_are_area_weighted);

        // Sum contribution to sync aofs
        auto const& aofs_arr = aofs.array(mfi, aofs_comp);

        amrex::ParallelFor(bx, ncomp, [aofs_arr, divtmp_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        { aofs_arr( i, j, k, n ) += -divtmp_arr( i, j, k, n ); });

        Gpu::streamSynchronize();  // otherwise we might be using too much memory
    }
}